

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

void proto3_unittest::TestUnpackedTypes::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 0xe));
    google::protobuf::RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)(self + 0xd));
    google::protobuf::RepeatedField<double>::~RepeatedField((RepeatedField<double> *)(self + 0xc));
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)(self + 0xb));
    google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)(self + 10));
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 9));
    google::protobuf::RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)(self + 8));
    google::protobuf::RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)(self + 7));
    google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)(self + 6));
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 5));
    google::protobuf::RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)(self + 4));
    google::protobuf::RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)(self + 3));
    google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)(self + 2));
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 1));
    return;
  }
  SharedDtor((TestUnpackedTypes *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestUnpackedTypes::SharedDtor(MessageLite& self) {
  TestUnpackedTypes& this_ = static_cast<TestUnpackedTypes&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}